

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Converter.cpp
# Opt level: O1

bool __thiscall Process::Converter::checkValue(Converter *this,string *s)

{
  byte *pbVar1;
  byte *__s1;
  size_t __n;
  pointer pbVar2;
  int iVar3;
  long *plVar4;
  size_type *psVar5;
  size_t sVar6;
  string *__range1;
  pointer pbVar7;
  bool bVar8;
  bool bVar9;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  Converter *local_40;
  string *local_38;
  
  iVar3 = std::__cxx11::string::compare((char *)s);
  if (iVar3 == 0) {
    return true;
  }
  __s1 = (byte *)(s->_M_dataplus)._M_p;
  __n = s->_M_string_length;
  bVar8 = __n == 0;
  bVar9 = bVar8;
  if ((!bVar8) && ((byte)((*__s1 & 0xdf) + 0xbf) < 0x1a)) {
    sVar6 = 1;
    do {
      bVar9 = __n == sVar6;
      if (bVar9) break;
      pbVar1 = __s1 + sVar6;
      sVar6 = sVar6 + 1;
    } while ((byte)((*pbVar1 & 0xdf) + 0xbf) < 0x1a);
  }
  if (!bVar9) {
    bVar9 = bVar8;
    if ((__n != 0) && ((byte)(*__s1 - 0x30) < 10)) {
      sVar6 = 1;
      do {
        bVar9 = __n == sVar6;
        if (bVar9) break;
        pbVar1 = __s1 + sVar6;
        sVar6 = sVar6 + 1;
      } while ((byte)(*pbVar1 - 0x30) < 10);
    }
    if (!bVar9) {
      std::operator+(&local_60,"The value : ",s);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_60);
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      psVar5 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_80.field_2._M_allocated_capacity = *psVar5;
        local_80.field_2._8_8_ = plVar4[3];
      }
      else {
        local_80.field_2._M_allocated_capacity = *psVar5;
        local_80._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_80._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      error(this,&local_80);
      goto LAB_001070b7;
    }
  }
  if ((__n != 0) && ((byte)(*__s1 - 0x30) < 10)) {
    sVar6 = 1;
    do {
      bVar8 = __n == sVar6;
      if (bVar8) break;
      pbVar1 = __s1 + sVar6;
      sVar6 = sVar6 + 1;
    } while ((byte)(*pbVar1 - 0x30) < 10);
  }
  if (bVar8) {
    return true;
  }
  pbVar2 = (this->_contVar).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_40 = this;
  local_38 = s;
  for (pbVar7 = (this->_contVar).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; bVar9 = pbVar7 != pbVar2, bVar9;
      pbVar7 = pbVar7 + 1) {
    bVar8 = __n == pbVar7->_M_string_length;
    if (bVar8 && __n != 0) {
      iVar3 = bcmp(__s1,(pbVar7->_M_dataplus)._M_p,__n);
      bVar8 = iVar3 == 0;
    }
    if (bVar8) {
      if (bVar9) {
        return true;
      }
      break;
    }
  }
  std::operator+(&local_60,"The value : ",local_38);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_60);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_80.field_2._M_allocated_capacity = *psVar5;
    local_80.field_2._8_8_ = plVar4[3];
  }
  else {
    local_80.field_2._M_allocated_capacity = *psVar5;
    local_80._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_80._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  error(local_40,&local_80);
LAB_001070b7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool Converter::checkValue(const std::string &s)
    {
        if (s == "UWUAC")
            return true;
        if (!isChar(s)
        && !isNb(s))
            return error("The value : " + s + " is not handled!");

        if (isNb(s))
            return true;

        for (const std::string &v : _contVar)
            if (s == v)
                return true;
        return error("The value : " + s + " is undefined!");
    }